

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

float nk_font_text_width(nk_handle handle,float height,char *text,int len)

{
  float fVar1;
  int iVar2;
  nk_font_glyph *pnVar3;
  int iVar4;
  nk_rune unicode;
  float local_3c;
  nk_rune local_34;
  
  if (handle.ptr == (void *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x327e,"float nk_font_text_width(nk_handle, float, const char *, int)");
  }
  if (*(long *)((long)handle.ptr + 0x58) != 0) {
    local_3c = 0.0;
    if (len != 0 && text != (char *)0x0) {
      fVar1 = *(float *)((long)handle.ptr + 0x30);
      iVar2 = nk_utf_decode(text,&local_34,len);
      if (iVar2 != 0) {
        local_3c = 0.0;
        iVar4 = iVar2;
        while (((iVar4 <= len && (iVar2 != 0)) && (local_34 != 0xfffd))) {
          pnVar3 = nk_font_find_glyph((nk_font *)handle.ptr,local_34);
          local_3c = local_3c + pnVar3->xadvance * (height / fVar1);
          iVar2 = nk_utf_decode(text + iVar4,&local_34,len - iVar4);
          iVar4 = iVar4 + iVar2;
        }
      }
    }
    return local_3c;
  }
  __assert_fail("font->glyphs",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x327f,"float nk_font_text_width(nk_handle, float, const char *, int)");
}

Assistant:

NK_INTERN float
nk_font_text_width(nk_handle handle, float height, const char *text, int len)
{
    nk_rune unicode;
    int text_len  = 0;
    float text_width = 0;
    int glyph_len = 0;
    float scale = 0;

    struct nk_font *font = (struct nk_font*)handle.ptr;
    NK_ASSERT(font);
    NK_ASSERT(font->glyphs);
    if (!font || !text || !len)
        return 0;

    scale = height/font->info.height;
    glyph_len = text_len = nk_utf_decode(text, &unicode, (int)len);
    if (!glyph_len) return 0;
    while (text_len <= (int)len && glyph_len) {
        const struct nk_font_glyph *g;
        if (unicode == NK_UTF_INVALID) break;

        /* query currently drawn glyph information */
        g = nk_font_find_glyph(font, unicode);
        text_width += g->xadvance * scale;

        /* offset next glyph */
        glyph_len = nk_utf_decode(text + text_len, &unicode, (int)len - text_len);
        text_len += glyph_len;
    }
    return text_width;
}